

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void common_kv_cache_dump_view_seqs(llama_kv_cache_view *view,int row_size)

{
  int iVar1;
  __node_base_ptr p_Var2;
  __node_base _Var3;
  size_type sVar4;
  mapped_type *pmVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  __hash_code __code;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  __node_base_ptr p_Var11;
  int iVar12;
  llama_seq_id *plVar13;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  seqs;
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  iVar12 = 0;
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n"
         ,(ulong)(uint)view->n_cells,(ulong)(uint)view->n_seq_max,(ulong)(uint)view->used_cells,
         (ulong)(uint)view->token_count,(ulong)(uint)view->max_contiguous,view->max_contiguous_idx);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < view->n_cells) {
    plVar13 = view->cells_sequences;
    do {
      uVar9 = view->n_seq_max;
      uVar8 = (ulong)uVar9;
      if (0 < (int)uVar9) {
        lVar10 = 0;
        do {
          sVar4 = local_68._M_element_count;
          uVar9 = (uint)uVar8;
          iVar1 = plVar13[lVar10];
          if (-1 < (long)iVar1) {
            uVar8 = (ulong)(long)iVar1 % local_68._M_bucket_count;
            p_Var2 = local_68._M_buckets[uVar8];
            p_Var6 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var6 = p_Var2, p_Var11 = p_Var2->_M_nxt,
               iVar1 != *(int *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var6 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&p_Var7[1]._M_nxt % local_68._M_bucket_count != uVar8) ||
                   (p_Var6 = p_Var11, p_Var11 = p_Var7, iVar1 == *(int *)&p_Var7[1]._M_nxt))
                goto LAB_001fa0ec;
              }
              p_Var6 = (__node_base_ptr)0x0;
            }
LAB_001fa0ec:
            if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
              if (local_68._M_element_count - 0x3e < 0xffffffffffffffc1) break;
              pmVar5 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_68,plVar13 + lVar10);
              *pmVar5 = sVar4;
            }
          }
          lVar10 = lVar10 + 1;
          uVar9 = view->n_seq_max;
          uVar8 = (ulong)(int)uVar9;
        } while (lVar10 < (long)uVar8);
      }
      if (local_68._M_element_count - 0x3e < 0xffffffffffffffc1) break;
      iVar12 = iVar12 + 1;
      plVar13 = plVar13 + (int)uVar9;
    } while (iVar12 < view->n_cells);
  }
  printf("=== Sequence legend: ");
  for (_Var3._M_nxt = local_68._M_before_begin._M_nxt; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    printf("%zu=%d, ",_Var3._M_nxt[2]._M_nxt,(ulong)*(uint *)&_Var3._M_nxt[1]._M_nxt);
  }
  printf("\'+\'=other sequence ids");
  if (0 < view->n_cells) {
    plVar13 = view->cells_sequences;
    uVar9 = 0;
    do {
      if ((int)uVar9 % row_size == 0) {
        printf("\n%5d: ",(ulong)uVar9);
      }
      if (0 < view->n_seq_max) {
        lVar10 = 0;
        do {
          iVar12 = plVar13[lVar10];
          if ((long)iVar12 < 0) {
            iVar12 = 0x2e;
          }
          else {
            uVar8 = (ulong)(long)iVar12 % local_68._M_bucket_count;
            p_Var2 = local_68._M_buckets[uVar8];
            p_Var6 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var6 = p_Var2, p_Var11 = p_Var2->_M_nxt,
               iVar12 != *(int *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var6 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&p_Var7[1]._M_nxt % local_68._M_bucket_count != uVar8) ||
                   (p_Var6 = p_Var11, p_Var11 = p_Var7, iVar12 == *(int *)&p_Var7[1]._M_nxt))
                goto LAB_001fa246;
              }
              p_Var6 = (__node_base_ptr)0x0;
            }
LAB_001fa246:
            if (p_Var6 == (__node_base_ptr)0x0) {
              p_Var7 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var7 = p_Var6->_M_nxt;
            }
            if (p_Var7 == (_Hash_node_base *)0x0) {
              iVar12 = 0x2b;
            }
            else {
              iVar12 = (int)*(char *)&p_Var7[2]._M_nxt[0x449ca]._M_nxt;
            }
          }
          putchar(iVar12);
          lVar10 = lVar10 + 1;
        } while (lVar10 < view->n_seq_max);
      }
      putchar(0x20);
      uVar9 = uVar9 + 1;
      plVar13 = plVar13 + view->n_seq_max;
    } while ((int)uVar9 < view->n_cells);
  }
  puts("\n=== Done dumping");
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void common_kv_cache_dump_view_seqs(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    std::unordered_map<llama_seq_id, size_t> seqs;
    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] < 0) { continue; }
            if (seqs.find(cs_curr[j]) == seqs.end()) {
                if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
                const size_t sz = seqs.size();
                seqs[cs_curr[j]] = sz;
            }
        }
        if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
    }

    printf("=== Sequence legend: ");
    for (const auto & it : seqs) {
        printf("%zu=%d, ", it.second, it.first);
    }
    printf("'+'=other sequence ids");

    c_curr = view.cells;
    cs_curr = view.cells_sequences;
    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) {
                const auto & it = seqs.find(cs_curr[j]);
                putchar(it != seqs.end() ? int(slot_chars[it->second]) : '+');
            } else {
                putchar('.');
            }
        }
        putchar(' ');
    }

    printf("\n=== Done dumping\n");
}